

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-print.cc
# Opt level: O1

void __thiscall IR::Print::visit(Print *this,Save *s)

{
  Temp *pTVar1;
  char cVar2;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  args;
  undefined8 local_18;
  size_type sStack_10;
  
  pTVar1 = (s->super_tuple<const_IR::Temp_*>).super__Tuple_impl<0UL,_const_IR::Temp_*>.
           super__Head_base<0UL,_const_IR::Temp_*,_false>._M_head_impl;
  local_18 = (pTVar1->
             super_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_dataplus;
  sStack_10 = *(size_type *)
               ((long)&(pTVar1->
                       super_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ).
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                       ._M_head_impl + 8);
  format_str.size_ = 0x10;
  format_str.data_ = "\t{0} = yycursor;";
  args.field_1.values_ =
       (value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
        *)&local_18;
  args.desc_ = 0xd;
  fmt::v7::vprint<char>(this->out,format_str,args);
  cVar2 = (char)this->out;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Print::visit(IR::Save* s) {
  fmt::print(out, "\t{0} = yycursor;", s->target()->name());
  out << std::endl;
}